

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdLoad.c
# Opt level: O3

int CmdCommandLoad(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  char cVar2;
  size_t sVar3;
  int iVar4;
  uint *__ptr;
  void *pvVar5;
  size_t sVar6;
  FILE *__stream;
  undefined8 uVar7;
  ulong uVar8;
  char *pcVar9;
  uint *puVar10;
  int i;
  uint uVar11;
  long lVar12;
  int i_1;
  ulong uVar13;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar5 = malloc(100);
  *(void **)(__ptr + 2) = pvVar5;
  uVar11 = 0;
  lVar12 = 0;
  while( true ) {
    cVar2 = "abccmd_"[lVar12];
    if (uVar11 == *__ptr) {
      if ((int)uVar11 < 0x10) {
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar5 = malloc(0x10);
        }
        else {
          pvVar5 = realloc(*(void **)(__ptr + 2),0x10);
        }
        *(void **)(__ptr + 2) = pvVar5;
        *__ptr = 0x10;
      }
      else {
        uVar1 = uVar11 * 2;
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar5 = malloc((ulong)uVar1);
        }
        else {
          pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar1);
        }
        *(void **)(__ptr + 2) = pvVar5;
        *__ptr = uVar1;
      }
    }
    else {
      pvVar5 = *(void **)(__ptr + 2);
    }
    __ptr[1] = uVar11 + 1;
    *(char *)((long)pvVar5 + (long)(int)uVar11) = cVar2;
    if (lVar12 == 6) break;
    uVar11 = __ptr[1];
    lVar12 = lVar12 + 1;
  }
  pcVar9 = *argv;
  sVar6 = strlen(pcVar9);
  if (0 < (int)(uint)sVar6) {
    uVar13 = 0;
    do {
      cVar2 = pcVar9[uVar13];
      uVar11 = __ptr[1];
      if (uVar11 == *__ptr) {
        if ((int)uVar11 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(0x10);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),0x10);
          }
          *(void **)(__ptr + 2) = pvVar5;
          *__ptr = 0x10;
        }
        else {
          sVar3 = (ulong)uVar11 * 2;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(sVar3);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),sVar3);
          }
          *(void **)(__ptr + 2) = pvVar5;
          *__ptr = (uint)sVar3;
        }
      }
      else {
        pvVar5 = *(void **)(__ptr + 2);
      }
      __ptr[1] = uVar11 + 1;
      *(char *)((long)pvVar5 + (long)(int)uVar11) = cVar2;
      uVar13 = uVar13 + 1;
    } while (((uint)sVar6 & 0x7fffffff) != uVar13);
  }
  lVar12 = 0;
  do {
    cVar2 = "capo.exe"[lVar12 + 4];
    uVar11 = __ptr[1];
    if (uVar11 == *__ptr) {
      if ((int)uVar11 < 0x10) {
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar5 = malloc(0x10);
        }
        else {
          pvVar5 = realloc(*(void **)(__ptr + 2),0x10);
        }
        *(void **)(__ptr + 2) = pvVar5;
        *__ptr = 0x10;
      }
      else {
        sVar6 = (ulong)uVar11 * 2;
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar5 = malloc(sVar6);
        }
        else {
          pvVar5 = realloc(*(void **)(__ptr + 2),sVar6);
        }
        *(void **)(__ptr + 2) = pvVar5;
        *__ptr = (uint)sVar6;
      }
    }
    else {
      pvVar5 = *(void **)(__ptr + 2);
    }
    __ptr[1] = uVar11 + 1;
    *(char *)((long)pvVar5 + (long)(int)uVar11) = cVar2;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  uVar11 = __ptr[1];
  if (uVar11 == *__ptr) {
    if ((int)uVar11 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar5 = malloc(0x10);
      }
      else {
        pvVar5 = realloc(*(void **)(__ptr + 2),0x10);
      }
      *(void **)(__ptr + 2) = pvVar5;
      *__ptr = 0x10;
    }
    else {
      sVar6 = (ulong)uVar11 * 2;
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar5 = malloc(sVar6);
      }
      else {
        pvVar5 = realloc(*(void **)(__ptr + 2),sVar6);
      }
      *(void **)(__ptr + 2) = pvVar5;
      *__ptr = (uint)sVar6;
    }
  }
  else {
    pvVar5 = *(void **)(__ptr + 2);
  }
  __ptr[1] = uVar11 + 1;
  *(undefined1 *)((long)pvVar5 + (long)(int)uVar11) = 0;
  pcVar9 = *(char **)(__ptr + 2);
  __stream = fopen(pcVar9,"r");
  if (__stream == (FILE *)0x0) {
    if (pcVar9 != (char *)0x0) {
      free(pcVar9);
    }
    puVar10 = __ptr;
    free(__ptr);
    iVar4 = (int)puVar10;
    uVar7 = *(undefined8 *)(__ptr + 2);
    pcVar9 = "Cannot run the binary \"%s\".\n\n";
  }
  else {
    fclose(__stream);
    if ((int)__ptr[1] < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                    ,0x249,"char Vec_StrPop(Vec_Str_t *)");
    }
    uVar11 = __ptr[1] - 1;
    if (1 < argc) {
      uVar13 = 1;
      do {
        if (uVar11 == *__ptr) {
          if ((int)uVar11 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc(0x10);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),0x10);
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = 0x10;
          }
          else {
            uVar1 = uVar11 * 2;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar5 = malloc((ulong)uVar1);
            }
            else {
              pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar1);
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = uVar1;
          }
        }
        else {
          pvVar5 = *(void **)(__ptr + 2);
        }
        __ptr[1] = uVar11 + 1;
        *(undefined1 *)((long)pvVar5 + (long)(int)uVar11) = 0x20;
        pcVar9 = argv[uVar13];
        sVar6 = strlen(pcVar9);
        if (0 < (int)(uint)sVar6) {
          uVar8 = 0;
          do {
            cVar2 = pcVar9[uVar8];
            uVar11 = __ptr[1];
            if (uVar11 == *__ptr) {
              if ((int)uVar11 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar5 = malloc(0x10);
                }
                else {
                  pvVar5 = realloc(*(void **)(__ptr + 2),0x10);
                }
                *(void **)(__ptr + 2) = pvVar5;
                *__ptr = 0x10;
              }
              else {
                sVar3 = (ulong)uVar11 * 2;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar5 = malloc(sVar3);
                }
                else {
                  pvVar5 = realloc(*(void **)(__ptr + 2),sVar3);
                }
                *(void **)(__ptr + 2) = pvVar5;
                *__ptr = (uint)sVar3;
              }
            }
            else {
              pvVar5 = *(void **)(__ptr + 2);
            }
            __ptr[1] = uVar11 + 1;
            *(char *)((long)pvVar5 + (long)(int)uVar11) = cVar2;
            uVar8 = uVar8 + 1;
          } while (((uint)sVar6 & 0x7fffffff) != uVar8);
        }
        uVar13 = uVar13 + 1;
        uVar11 = __ptr[1];
      } while (uVar13 != (uint)argc);
    }
    if (uVar11 == *__ptr) {
      if ((int)uVar11 < 0x10) {
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar5 = malloc(0x10);
        }
        else {
          pvVar5 = realloc(*(void **)(__ptr + 2),0x10);
        }
        *(void **)(__ptr + 2) = pvVar5;
        *__ptr = 0x10;
      }
      else {
        uVar1 = uVar11 * 2;
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar5 = malloc((ulong)uVar1);
        }
        else {
          pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar1);
        }
        *(void **)(__ptr + 2) = pvVar5;
        *__ptr = uVar1;
      }
    }
    else {
      pvVar5 = *(void **)(__ptr + 2);
    }
    __ptr[1] = uVar11 + 1;
    *(undefined1 *)((long)pvVar5 + (long)(int)uVar11) = 0;
    pcVar9 = *(char **)(__ptr + 2);
    iVar4 = Util_SignalSystem(pcVar9);
    if (iVar4 == 0) {
      if (pcVar9 != (char *)0x0) {
        free(pcVar9);
      }
      free(__ptr);
      return 0;
    }
    if (pcVar9 != (char *)0x0) {
      free(pcVar9);
    }
    puVar10 = __ptr;
    free(__ptr);
    iVar4 = (int)puVar10;
    Abc_Print(iVar4,"The following command has returned non-zero exit status:\n");
    uVar7 = *(undefined8 *)(__ptr + 2);
    pcVar9 = "\"%s\"\n";
  }
  Abc_Print(iVar4,pcVar9,uVar7);
  return 1;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function********************************************************************

  Synopsis    []

  Description []

  SideEffects []

  SeeAlso     []

******************************************************************************/
int CmdCommandLoad( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Str_t * vCommand;
    FILE * pFile;
    int i;
    vCommand = Vec_StrAlloc( 100 );
    Vec_StrAppend( vCommand, "abccmd_" );
    Vec_StrAppend( vCommand, argv[0] );
    Vec_StrAppend( vCommand, ".exe" );
    Vec_StrPush( vCommand, 0 );
    // check if there is the binary
    if ( (pFile = fopen( Vec_StrArray(vCommand), "r" )) == NULL )
    {
        Vec_StrFree( vCommand );
        Abc_Print( -1, "Cannot run the binary \"%s\".\n\n", Vec_StrArray(vCommand) );
        return 1;
    }
    fclose( pFile );
    Vec_StrPop( vCommand );
    // add other arguments
    for ( i = 1; i < argc; i++ )
    {
        Vec_StrAppend( vCommand, " " );
        Vec_StrAppend( vCommand, argv[i] );
    }
    Vec_StrPush( vCommand, 0 );
    // run the command line
    if ( Util_SignalSystem( Vec_StrArray(vCommand) ) )
    {
        Vec_StrFree( vCommand );
        Abc_Print( -1, "The following command has returned non-zero exit status:\n" );
        Abc_Print( -1, "\"%s\"\n", Vec_StrArray(vCommand) );
        return 1;
    }
    Vec_StrFree( vCommand );
    return 0;
}